

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O1

void __thiscall soplex::CLUFactorRational::remaxCol(CLUFactorRational *this,int p_col,int len)

{
  Col *pCVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  Dring *pDVar7;
  Dring *pDVar8;
  long lVar9;
  int *piVar10;
  Dring *pDVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  
  pCVar1 = &(this->u).col;
  if ((Col *)(this->u).col.elem[p_col].next == pCVar1) {
    piVar10 = (this->u).col.max;
    iVar12 = len - piVar10[p_col];
    if (iVar12 <= (this->u).col.size - (this->u).col.used) goto LAB_0018c6bb;
    pDVar11 = (this->u).col.list.next;
    if ((Col *)pDVar11 == pCVar1) {
      uVar13 = 0;
    }
    else {
      piVar4 = (this->u).col.idx;
      piVar5 = (this->u).col.len;
      piVar6 = (this->u).col.start;
      uVar14 = 0;
      do {
        iVar12 = pDVar11->idx;
        if (piVar6[iVar12] != (int)uVar14) goto LAB_0018c51c;
        uVar13 = (int)uVar14 + piVar5[iVar12];
        uVar14 = (ulong)uVar13;
        piVar10[iVar12] = piVar5[iVar12];
        pDVar11 = pDVar11->next;
      } while ((Col *)pDVar11 != pCVar1);
    }
    goto LAB_0018c65e;
  }
  if (len <= (this->u).col.size - (this->u).col.used) goto LAB_0018c5b9;
  pDVar11 = (this->u).col.list.next;
  piVar10 = (this->u).col.max;
  if ((Col *)pDVar11 == pCVar1) {
    uVar13 = 0;
  }
  else {
    piVar4 = (this->u).col.idx;
    piVar5 = (this->u).col.len;
    piVar6 = (this->u).col.start;
    uVar14 = 0;
    do {
      iVar12 = pDVar11->idx;
      if (piVar6[iVar12] != (int)uVar14) goto LAB_0018c46c;
      uVar13 = (int)uVar14 + piVar5[iVar12];
      uVar14 = (ulong)uVar13;
      piVar10[iVar12] = piVar5[iVar12];
      pDVar11 = pDVar11->next;
    } while ((Col *)pDVar11 != pCVar1);
  }
  goto LAB_0018c563;
LAB_0018c51c:
  do {
    iVar12 = pDVar11->idx;
    iVar2 = piVar6[iVar12];
    lVar9 = (long)iVar2;
    piVar6[iVar12] = (int)uVar14;
    piVar10[iVar12] = piVar5[iVar12];
    iVar12 = piVar5[iVar12];
    if (0 < iVar12) {
      uVar14 = (ulong)(int)uVar14;
      do {
        piVar4[uVar14] = piVar4[lVar9];
        uVar14 = uVar14 + 1;
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar12 + iVar2);
    }
    uVar13 = (uint)uVar14;
    pDVar11 = pDVar11->next;
  } while ((Col *)pDVar11 != pCVar1);
LAB_0018c65e:
  (this->u).col.used = uVar13;
  piVar10[this->thedim] = 0;
  iVar2 = (this->u).col.size;
  iVar3 = (this->u).col.used;
  iVar12 = len - piVar10[p_col];
  if (((double)iVar2 < (double)len + (double)iVar3 * this->colMemMult) &&
     (iVar3 = len + iVar3 * 2, iVar2 < iVar3)) {
    (this->u).col.size = iVar3;
    spx_realloc<int*>(&(this->u).col.idx,iVar3);
  }
LAB_0018c6bb:
  piVar10 = &(this->u).col.used;
  *piVar10 = *piVar10 + iVar12;
  (this->u).col.max[p_col] = len;
  return;
LAB_0018c46c:
  do {
    iVar12 = pDVar11->idx;
    iVar2 = piVar6[iVar12];
    lVar9 = (long)iVar2;
    piVar6[iVar12] = (int)uVar14;
    piVar10[iVar12] = piVar5[iVar12];
    iVar12 = piVar5[iVar12];
    if (0 < iVar12) {
      uVar14 = (ulong)(int)uVar14;
      do {
        piVar4[uVar14] = piVar4[lVar9];
        uVar14 = uVar14 + 1;
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar12 + iVar2);
    }
    uVar13 = (uint)uVar14;
    pDVar11 = pDVar11->next;
  } while ((Col *)pDVar11 != pCVar1);
LAB_0018c563:
  (this->u).col.used = uVar13;
  piVar10[this->thedim] = 0;
  iVar12 = (this->u).col.size;
  iVar2 = (this->u).col.used;
  if (((double)iVar12 < (double)len + (double)iVar2 * this->colMemMult) &&
     (iVar2 = len + iVar2 * 2, iVar12 < iVar2)) {
    (this->u).col.size = iVar2;
    spx_realloc<int*>(&(this->u).col.idx,iVar2);
  }
LAB_0018c5b9:
  iVar12 = (this->u).col.used;
  piVar10 = (this->u).col.start;
  iVar2 = piVar10[p_col];
  lVar9 = (long)iVar2;
  iVar3 = (this->u).col.len[p_col];
  piVar10[p_col] = iVar12;
  piVar10 = &(this->u).col.used;
  *piVar10 = *piVar10 + len;
  piVar10 = (this->u).col.max;
  pDVar11 = (this->u).col.elem + p_col;
  piVar10[pDVar11->prev->idx] = piVar10[pDVar11->prev->idx] + piVar10[p_col];
  piVar10[p_col] = len;
  pDVar7 = pDVar11->next;
  pDVar7->prev = pDVar11->prev;
  pDVar11->prev->next = pDVar7;
  pDVar7 = (this->u).col.list.prev;
  pDVar8 = pDVar7->next;
  pDVar11->next = pDVar8;
  pDVar8->prev = pDVar11;
  pDVar11->prev = pDVar7;
  pDVar7->next = pDVar11;
  if (0 < iVar3) {
    piVar4 = (this->u).col.idx;
    piVar10 = piVar4 + iVar12;
    do {
      *piVar10 = piVar4[lVar9];
      lVar9 = lVar9 + 1;
      piVar10 = piVar10 + 1;
    } while (lVar9 < iVar3 + iVar2);
  }
  return;
}

Assistant:

inline void CLUFactorRational::remaxCol(int p_col, int len)
{
   assert(u.col.max[p_col] < len);

   if(u.col.elem[p_col].next == &(u.col.list))      /* last in column file */
   {
      int delta = len - u.col.max[p_col];

      if(delta > u.col.size - u.col.used)
      {
         packColumns();
         delta = len - u.col.max[p_col];

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(delta <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      u.col.used += delta;
      u.col.max[p_col] = len;
   }

   else                        /* column must be moved to end of column file */
   {
      int i, j, k;
      int* idx;
      Dring* ring;

      if(len > u.col.size - u.col.used)
      {
         packColumns();

         if(u.col.size < colMemMult * u.col.used + len)
            minColMem(2 * u.col.used + len);

         /* minColMem(colMemMult * u.col.used + len); */
      }

      assert(len <= u.col.size - u.col.used

             && "ERROR: could not allocate memory for column file");

      j = u.col.used;
      i = u.col.start[p_col];
      k = u.col.len[p_col] + i;
      u.col.start[p_col] = j;
      u.col.used += len;

      u.col.max[u.col.elem[p_col].prev->idx] += u.col.max[p_col];
      u.col.max[p_col] = len;
      removeDR(u.col.elem[p_col]);
      ring = u.col.list.prev;
      init2DR(u.col.elem[p_col], *ring);

      idx = u.col.idx;

      for(; i < k; ++i)
         idx[j++] = idx[i];
   }
}